

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

int32_t utf8IteratorMove(UCharIterator *iter,int32_t delta,UCharIteratorOrigin origin)

{
  byte *pbVar1;
  byte bVar2;
  uint8_t *s;
  UChar32 UVar3;
  int iVar4;
  int32_t *piVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  uint local_3c [3];
  
  switch(origin) {
  case UITER_START:
  case UITER_ZERO:
    goto switchD_002c1971_caseD_0;
  case UITER_CURRENT:
    uVar11 = iter->index;
    if (-1 < (int)uVar11) {
      delta = delta + uVar11;
      goto switchD_002c1971_caseD_0;
    }
    if (delta == 0) {
      return -2;
    }
    local_3c[0] = iter->start;
LAB_002c1a72:
    if (local_3c[0] == -delta || SBORROW4(local_3c[0],-delta) != (int)(local_3c[0] + delta) < 0)
    goto LAB_002c1aa1;
    if ((int)(iter->limit - local_3c[0]) <= delta) {
      iVar4 = iter->length;
      iter->index = iVar4;
      iter->start = iter->limit;
      iter->reservedField = 0;
      if (iVar4 < 0) {
        return -2;
      }
      return iVar4;
    }
    goto LAB_002c1a37;
  case UITER_LIMIT:
  case UITER_LENGTH:
    break;
  default:
    return -1;
  }
  if (iter->length < 0) {
    iter->index = -1;
    local_3c[0] = iter->limit;
    iter->start = local_3c[0];
    iter->reservedField = 0;
    if (-1 < delta) {
      return -2;
    }
    uVar11 = 0xffffffff;
    goto LAB_002c1a72;
  }
  delta = delta + iter->length;
switchD_002c1971_caseD_0:
  if (delta < 1) {
LAB_002c1aa1:
    iter->reservedField = 0;
    iter->start = 0;
    iter->index = 0;
    return 0;
  }
  uVar9 = iter->length;
  if (uVar9 <= (uint)delta) {
    iter->index = uVar9;
    iter->start = iter->limit;
    iter->reservedField = 0;
    return uVar9;
  }
  piVar5 = &iter->index;
  uVar11 = *piVar5;
  if ((int)uVar11 < 0 || (uint)delta < uVar11 >> 1) {
    iter->reservedField = 0;
    iter->start = 0;
    uVar9 = 0;
LAB_002c1a28:
    *piVar5 = 0;
    uVar11 = uVar9;
  }
  else if ((-1 < (int)uVar9) && ((int)(uVar9 - delta) < (int)(delta - uVar11))) {
    iter->index = uVar9;
    iter->start = iter->limit;
    piVar5 = &iter->reservedField;
    goto LAB_002c1a28;
  }
  delta = delta - uVar11;
  if (delta == 0) {
    return uVar11;
  }
  local_3c[0] = iter->start;
LAB_002c1a37:
  uVar6 = (ulong)local_3c[0];
  s = (uint8_t *)iter->context;
  uVar9 = uVar11;
  if (delta < 1) {
    if (iter->reservedField != 0) {
      iter->reservedField = 0;
      local_3c[0] = local_3c[0] - 4;
      uVar9 = uVar11 - 1;
      delta = delta + 1;
    }
    do {
      if ((-1 < delta) || ((int)local_3c[0] < 1)) goto LAB_002c1cc1;
      local_3c[0] = local_3c[0] - 1;
      iVar4 = -1;
      iVar10 = 1;
      if (((char)s[local_3c[0]] < '\0') &&
         (UVar3 = utf8_prevCharSafeBody_63(s,0,(int32_t *)local_3c,(uint)s[local_3c[0]],-3),
         0xffff < UVar3)) {
        iVar4 = -2;
        iVar10 = 2;
        if (-2 < delta) {
          iter->reservedField = UVar3;
          uVar9 = uVar9 - 1;
          local_3c[0] = local_3c[0] + 4;
          goto LAB_002c1cc1;
        }
      }
      delta = delta + iVar10;
      uVar9 = uVar9 + iVar4;
    } while( true );
  }
  if (iter->reservedField != 0) {
    iter->reservedField = 0;
    delta = delta + -1;
    uVar9 = uVar11 + 1;
  }
  uVar14 = iter->limit;
  while( true ) {
    local_3c[0] = (uint)uVar6;
    bVar15 = (int)local_3c[0] < (int)uVar14 && 0 < delta;
    if ((int)local_3c[0] >= (int)uVar14 || 0 >= delta) break;
    lVar7 = (long)(int)local_3c[0];
    uVar6 = lVar7 + 1;
    bVar2 = s[lVar7];
    local_3c[0] = (uint)uVar6;
    iVar10 = 1;
    iVar4 = -1;
    if (local_3c[0] != uVar14 && (char)bVar2 < '\0') {
      if (bVar2 < 0xe0) {
        if (0xc1 < bVar2) {
          uVar13 = bVar2 & 0x1f;
LAB_002c1be6:
          lVar7 = (long)(int)local_3c[0];
          if (((byte)(s[lVar7] ^ 0x80) < 0x40) && (local_3c[0] = local_3c[0] + 1, 0x3ff < uVar13)) {
            if (delta < 2) {
              iter->reservedField = uVar13 << 6 | s[lVar7] ^ 0x80;
              uVar9 = uVar9 + 1;
              break;
            }
            iVar10 = 2;
            iVar4 = -2;
          }
          uVar6 = (ulong)local_3c[0];
        }
      }
      else if (bVar2 < 0xf0) {
        uVar13 = bVar2 & 0xf;
        if (((byte)" 000000000000\x1000"[uVar13] >> (s[uVar6] >> 5) & 1) != 0) {
          bVar12 = s[uVar6] & 0x3f;
LAB_002c1bb8:
          local_3c[0] = (int)uVar6 + 1;
          uVar6 = (ulong)uVar14;
          if (local_3c[0] != uVar14) {
            uVar13 = (uint)bVar12 | uVar13 << 6;
            goto LAB_002c1be6;
          }
        }
      }
      else if (bVar2 < 0xf5) {
        pbVar1 = s + uVar6;
        if (((uint)(int)""[*pbVar1 >> 4] >> (bVar2 - 0xf0 & 0x1f) & 1) != 0) {
          uVar8 = lVar7 + 2;
          uVar6 = (ulong)uVar14;
          if ((uint)uVar8 != uVar14) {
            bVar12 = s[uVar8] + 0x80;
            if (bVar12 < 0x40) {
              uVar13 = *pbVar1 & 0x3f | (bVar2 - 0xf0) * 0x40;
              uVar6 = uVar8 & 0xffffffff;
              goto LAB_002c1bb8;
            }
            uVar6 = uVar8 & 0xffffffff;
          }
        }
      }
    }
    uVar9 = uVar9 + iVar10;
    delta = delta + iVar4;
  }
  if (local_3c[0] == uVar14) {
    local_3c[0] = uVar14;
    if (iter->length < 0) {
      if (-1 < (int)uVar11) {
        iter->length = bVar15 + uVar9;
      }
    }
    else if ((int)uVar11 < 0) {
      iVar4 = iter->length - (uint)bVar15;
      iter->index = iVar4;
      goto LAB_002c1cc5;
    }
  }
LAB_002c1cc1:
  uVar14 = local_3c[0];
  iVar4 = iter->index;
LAB_002c1cc5:
  iter->start = uVar14;
  if (iVar4 < 0) {
    uVar9 = 0xfffffffe;
    if ((int)uVar14 < 2) {
      iter->index = uVar14;
      uVar9 = uVar14;
    }
  }
  else {
    iter->index = uVar9;
  }
  return uVar9;
}

Assistant:

static int32_t U_CALLCONV
utf8IteratorMove(UCharIterator *iter, int32_t delta, UCharIteratorOrigin origin) {
    const uint8_t *s;
    UChar32 c;
    int32_t pos; /* requested UTF-16 index */
    int32_t i; /* UTF-8 index */
    UBool havePos;

    /* calculate the requested UTF-16 index */
    switch(origin) {
    case UITER_ZERO:
    case UITER_START:
        pos=delta;
        havePos=TRUE;
        /* iter->index<0 (unknown) is possible */
        break;
    case UITER_CURRENT:
        if(iter->index>=0) {
            pos=iter->index+delta;
            havePos=TRUE;
        } else {
            /* the current UTF-16 index is unknown after setState(), use only delta */
            pos=0;
            havePos=FALSE;
        }
        break;
    case UITER_LIMIT:
    case UITER_LENGTH:
        if(iter->length>=0) {
            pos=iter->length+delta;
            havePos=TRUE;
        } else {
            /* pin to the end, avoid counting the length */
            iter->index=-1;
            iter->start=iter->limit;
            iter->reservedField=0;
            if(delta>=0) {
                return UITER_UNKNOWN_INDEX;
            } else {
                /* the current UTF-16 index is unknown, use only delta */
                pos=0;
                havePos=FALSE;
            }
        }
        break;
    default:
        return -1;  /* Error */
    }

    if(havePos) {
        /* shortcuts: pinning to the edges of the string */
        if(pos<=0) {
            iter->index=iter->start=iter->reservedField=0;
            return 0;
        } else if(iter->length>=0 && pos>=iter->length) {
            iter->index=iter->length;
            iter->start=iter->limit;
            iter->reservedField=0;
            return iter->index;
        }

        /* minimize the number of U8_NEXT/PREV operations */
        if(iter->index<0 || pos<iter->index/2) {
            /* go forward from the start instead of backward from the current index */
            iter->index=iter->start=iter->reservedField=0;
        } else if(iter->length>=0 && (iter->length-pos)<(pos-iter->index)) {
            /*
             * if we have the UTF-16 index and length and the new position is
             * closer to the end than the current index,
             * then go backward from the end instead of forward from the current index
             */
            iter->index=iter->length;
            iter->start=iter->limit;
            iter->reservedField=0;
        }

        delta=pos-iter->index;
        if(delta==0) {
            return iter->index; /* nothing to do */
        }
    } else {
        /* move relative to unknown UTF-16 index */
        if(delta==0) {
            return UITER_UNKNOWN_INDEX; /* nothing to do */
        } else if(-delta>=iter->start) {
            /* moving backwards by more UChars than there are UTF-8 bytes, pin to 0 */
            iter->index=iter->start=iter->reservedField=0;
            return 0;
        } else if(delta>=(iter->limit-iter->start)) {
            /* moving forward by more UChars than the remaining UTF-8 bytes, pin to the end */
            iter->index=iter->length; /* may or may not be <0 (unknown) */
            iter->start=iter->limit;
            iter->reservedField=0;
            return iter->index>=0 ? iter->index : (int32_t)UITER_UNKNOWN_INDEX;
        }
    }

    /* delta!=0 */

    /* move towards the requested position, pin to the edges of the string */
    s=(const uint8_t *)iter->context;
    pos=iter->index; /* could be <0 (unknown) */
    i=iter->start;
    if(delta>0) {
        /* go forward */
        int32_t limit=iter->limit;
        if(iter->reservedField!=0) {
            iter->reservedField=0;
            ++pos;
            --delta;
        }
        while(delta>0 && i<limit) {
            U8_NEXT_OR_FFFD(s, i, limit, c);
            if(c<=0xffff) {
                ++pos;
                --delta;
            } else if(delta>=2) {
                pos+=2;
                delta-=2;
            } else /* delta==1 */ {
                /* stop in the middle of a supplementary code point */
                iter->reservedField=c;
                ++pos;
                break; /* delta=0; */
            }
        }
        if(i==limit) {
            if(iter->length<0 && iter->index>=0) {
                iter->length= iter->reservedField==0 ? pos : pos+1;
            } else if(iter->index<0 && iter->length>=0) {
                iter->index= iter->reservedField==0 ? iter->length : iter->length-1;
            }
        }
    } else /* delta<0 */ {
        /* go backward */
        if(iter->reservedField!=0) {
            iter->reservedField=0;
            i-=4; /* we stayed behind the supplementary code point; go before it now */
            --pos;
            ++delta;
        }
        while(delta<0 && i>0) {
            U8_PREV_OR_FFFD(s, 0, i, c);
            if(c<=0xffff) {
                --pos;
                ++delta;
            } else if(delta<=-2) {
                pos-=2;
                delta+=2;
            } else /* delta==-1 */ {
                /* stop in the middle of a supplementary code point */
                i+=4; /* back to behind this supplementary code point for consistent state */
                iter->reservedField=c;
                --pos;
                break; /* delta=0; */
            }
        }
    }

    iter->start=i;
    if(iter->index>=0) {
        return iter->index=pos;
    } else {
        /* we started with index<0 (unknown) so pos is bogus */
        if(i<=1) {
            return iter->index=i; /* reached the beginning */
        } else {
            /* we still don't know the UTF-16 index */
            return UITER_UNKNOWN_INDEX;
        }
    }
}